

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O0

int sort_5_4::insert_sort_1(int *a,int n)

{
  int iVar1;
  bool bVar2;
  code *pcVar3;
  int iVar4;
  int local_20;
  int local_1c;
  int i;
  int j;
  int t;
  int n_local;
  int *a_local;
  
  for (local_20 = 1; local_20 < n; local_20 = local_20 + 1) {
    iVar1 = a[local_20];
    iVar4 = local_20;
    while( true ) {
      local_1c = iVar4 + -1;
      bVar2 = false;
      if (-1 < local_1c) {
        bVar2 = iVar1 < a[local_1c];
      }
      if (!bVar2) break;
      a[iVar4] = a[local_1c];
      iVar4 = local_1c;
    }
    a[iVar4] = iVar1;
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

int insert_sort_1(int *a, int n) {
        int t, j;
        for (int i = 1; i < n; i++) {
            t = a[i];
            for (j = i - 1; j >= 0 && a[j] > t; j--)
                a[1 + j] = a[j];
            a[j + 1] = t;
        }
    }